

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[45]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char (*args_1) [45])

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_120;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_100 [40];
  string local_d8 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_b8;
  function<void()> local_a0 [32];
  tuple<char_data_*&,_const_char_(&)[45]> tuple;
  anon_class_64_3_3bdf3dc2 local_70;
  
  nTimer_local = nTimer;
  local_120 = func;
  if (nTimer < 0) {
    local_100._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_100);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[45]>.
  super__Tuple_impl<1UL,_const_char_(&)[45]>.super__Head_base<1UL,_const_char_(&)[45],_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_(&)[45],_false>)
                 (_Head_base<1UL,_const_char_(&)[45],_false>)args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[45]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_const(&)[45]>(&chs,this,&tuple);
  local_100._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_100 + 8),(string *)from);
  std::__cxx11::string::string(local_d8,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_b8,&chs);
  local_70.func = local_120;
  local_70.args = *args;
  local_70._16_1_ = *(char *)((long)args_1 + 0);
  local_70._17_1_ = *(char *)((long)args_1 + 1);
  local_70._18_1_ = *(char *)((long)args_1 + 2);
  local_70._19_1_ = *(char *)((long)args_1 + 3);
  local_70._20_1_ = *(char *)((long)args_1 + 4);
  local_70._21_1_ = *(char *)((long)args_1 + 5);
  local_70._22_1_ = *(char *)((long)args_1 + 6);
  local_70._23_1_ = *(char *)((long)args_1 + 7);
  local_70._24_1_ = *(char *)((long)args_1 + 8);
  local_70._25_1_ = *(char *)((long)args_1 + 9);
  local_70._26_1_ = *(char *)((long)args_1 + 10);
  local_70._27_1_ = *(char *)((long)args_1 + 0xb);
  local_70._28_1_ = *(char *)((long)args_1 + 0xc);
  local_70._29_1_ = *(char *)((long)args_1 + 0xd);
  local_70._30_1_ = *(char *)((long)args_1 + 0xe);
  local_70._31_1_ = *(char *)((long)args_1 + 0xf);
  local_70._32_1_ = *(char *)((long)args_1 + 0x10);
  local_70._33_1_ = *(char *)((long)args_1 + 0x11);
  local_70._34_1_ = *(char *)((long)args_1 + 0x12);
  local_70._35_1_ = *(char *)((long)args_1 + 0x13);
  local_70._36_1_ = *(char *)((long)args_1 + 0x14);
  local_70._37_1_ = *(char *)((long)args_1 + 0x15);
  local_70._38_1_ = *(char *)((long)args_1 + 0x16);
  local_70._39_1_ = *(char *)((long)args_1 + 0x17);
  local_70._53_1_ = *(char *)((long)args_1 + 0x25);
  local_70._54_1_ = *(char *)((long)args_1 + 0x26);
  local_70._55_1_ = *(char *)((long)args_1 + 0x27);
  local_70._56_1_ = *(char *)((long)args_1 + 0x28);
  local_70._57_1_ = *(char *)((long)args_1 + 0x29);
  local_70._58_1_ = *(char *)((long)args_1 + 0x2a);
  local_70._59_1_ = *(char *)((long)args_1 + 0x2b);
  local_70._60_1_ = *(char *)((long)args_1 + 0x2c);
  local_70._40_5_ = SUB85(*(undefined8 *)(*args_1 + 0x18),0);
  local_70._45_3_ = SUB83(*(undefined8 *)(*args_1 + 0x1d),0);
  local_70._48_5_ = SUB85((ulong)*(undefined8 *)(*args_1 + 0x1d) >> 0x18,0);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[45]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[45])::_lambda()_1_,void>
            (local_a0,&local_70);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_100);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_100);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}